

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::StringFieldGenerator::GenerateMessageClearingCode
          (StringFieldGenerator *this,Printer *printer)

{
  int iVar1;
  char *pcVar2;
  char *text;
  
  iVar1 = *(int *)(*(long *)(this->descriptor_ + 0x30) + 0x8c);
  if (iVar1 != 3) {
    io::Printer::Print(printer,&this->variables_,
                       "GOOGLE_DCHECK(!$name$_.IsDefault($default_variable$));\n");
  }
  if (*(char *)(*(long *)(*(long *)(this->descriptor_ + 0x30) + 0xa0) + 0xa7) == '\x01') {
    pcVar2 = "$name$_.ClearToEmpty($default_variable$, GetArenaNoVirtual());\n";
    text = "$name$_.ClearToDefault($default_variable$, GetArenaNoVirtual());\n";
  }
  else if (iVar1 == 3) {
    pcVar2 = "$name$_.ClearToEmptyNoArena($default_variable$);\n";
    text = "$name$_.ClearToDefaultNoArena($default_variable$);\n";
  }
  else {
    pcVar2 = "(*$name$_.UnsafeRawStringPointer())->clear();\n";
    text = "(*$name$_.UnsafeRawStringPointer())->assign(*$default_variable$);\n";
  }
  if (*(long *)(*(long *)(this->descriptor_ + 0xa0) + 8) == 0) {
    text = pcVar2;
  }
  io::Printer::Print(printer,&this->variables_,text);
  return;
}

Assistant:

void StringFieldGenerator::
GenerateMessageClearingCode(io::Printer* printer) const {
  // Two-dimension specialization here: supporting arenas, field presence, or
  // not, and default value is the empty string or not. Complexity here ensures
  // the minimal number of branches / amount of extraneous code at runtime
  // (given that the below methods are inlined one-liners)!

  // If we have field presence, then the Clear() method of the protocol buffer
  // will have checked that this field is set.  If so, we can avoid redundant
  // checks against default_variable.
  const bool must_be_present = HasFieldPresence(descriptor_->file());

  if (must_be_present) {
    printer->Print(variables_,
      "GOOGLE_DCHECK(!$name$_.IsDefault($default_variable$));\n");
  }

  if (SupportsArenas(descriptor_)) {
    if (descriptor_->default_value_string().empty()) {
      printer->Print(variables_,
        "$name$_.ClearToEmpty($default_variable$, GetArenaNoVirtual());\n");
    } else {
      printer->Print(variables_,
        "$name$_.ClearToDefault($default_variable$, GetArenaNoVirtual());\n");
    }
  } else if (must_be_present) {
    // When Arenas are disabled and field presence has been checked, we can
    // safely treat the ArenaStringPtr as a string*.
    if (descriptor_->default_value_string().empty()) {
      printer->Print(variables_,
        "(*$name$_.UnsafeRawStringPointer())->clear();\n");
    } else {
      printer->Print(variables_,
        "(*$name$_.UnsafeRawStringPointer())->assign(*$default_variable$);\n");
    }
  } else {
    if (descriptor_->default_value_string().empty()) {
      printer->Print(variables_,
        "$name$_.ClearToEmptyNoArena($default_variable$);\n");
    } else {
      printer->Print(variables_,
        "$name$_.ClearToDefaultNoArena($default_variable$);\n");
    }
  }
}